

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O3

OptionalStorage<llbuild::buildsystem::BuildValue,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
          (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this,
          OptionalStorage<llbuild::buildsystem::BuildValue,_false> *O)

{
  if (O->hasVal == false) {
    if (this->hasVal == true) {
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)this);
      this->hasVal = false;
    }
  }
  else {
    operator=(this,(BuildValue *)O);
  }
  return this;
}

Assistant:

OptionalStorage &operator=(OptionalStorage &&O) {
    if (!O.hasVal)
      reset();
    else {
      *this = std::move(*O.getPointer());
    }
    return *this;
  }